

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O3

void __thiscall
soul::HTMLGenerator::printTOCNode
          (HTMLGenerator *this,HTMLElement *parent,TableOfContentsNode *node,bool isRoot)

{
  pointer pHVar1;
  Module *pMVar2;
  File *pFVar3;
  pointer pTVar4;
  HTMLElement *pHVar5;
  undefined7 in_register_00000009;
  TableOfContentsNode *n;
  pointer node_00;
  string_view value;
  string_view linkURL;
  string_view text;
  string_view value_00;
  string_view linkURL_00;
  string_view text_00;
  string_view value_01;
  string_view text_01;
  string_view value_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((int)CONCAT71(in_register_00000009,isRoot) == 0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"li","");
    std::vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>>::
    emplace_back<std::__cxx11::string>
              ((vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>> *)
               &parent->children,&local_50);
    pHVar1 = (parent->children).
             super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    parent = pHVar1 + -1;
    pMVar2 = node->module;
    if (pMVar2 == (Module *)0x0) {
      pFVar3 = node->file;
      if (pFVar3 == (File *)0x0) {
        value_01._M_str = "toc_item";
        value_01._M_len = 8;
        pHVar5 = choc::html::HTMLElement::setClass(parent,value_01);
        text_01._M_str = (node->name)._M_dataplus._M_p;
        text_01._M_len = (node->name)._M_string_length;
        choc::html::HTMLElement::addContent(pHVar5,text_01);
        goto LAB_0026446e;
      }
      value_00._M_str = "toc_module";
      value_00._M_len = 10;
      pHVar5 = choc::html::HTMLElement::setClass(parent,value_00);
      std::operator+(&local_90,"#",&pFVar3->UID);
      linkURL_00._M_str = local_90._M_dataplus._M_p;
      linkURL_00._M_len = local_90._M_string_length;
      pHVar5 = choc::html::HTMLElement::addLink(pHVar5,linkURL_00);
      text_00._M_str = (node->name)._M_dataplus._M_p;
      text_00._M_len = (node->name)._M_string_length;
      choc::html::HTMLElement::addContent(pHVar5,text_00);
    }
    else {
      value._M_str = "toc_item";
      value._M_len = 8;
      pHVar5 = choc::html::HTMLElement::setClass(parent,value);
      std::operator+(&local_90,"#",&pMVar2->UID);
      linkURL._M_str = local_90._M_dataplus._M_p;
      linkURL._M_len = local_90._M_string_length;
      pHVar5 = choc::html::HTMLElement::addLink(pHVar5,linkURL);
      text._M_str = (node->name)._M_dataplus._M_p;
      text._M_len = (node->name)._M_string_length;
      choc::html::HTMLElement::addContent(pHVar5,text);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
LAB_0026446e:
  if ((node->children).
      super__Vector_base<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (node->children).
      super__Vector_base<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ul","");
    std::vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>>::
    emplace_back<std::__cxx11::string>
              ((vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>> *)
               &parent->children,&local_70);
    value_02._M_str = "toc_item";
    value_02._M_len = 8;
    pHVar5 = choc::html::HTMLElement::setClass
                       ((parent->children).
                        super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1,value_02);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    pTVar4 = (node->children).
             super__Vector_base<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (node_00 = (node->children).
                   super__Vector_base<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
                   ._M_impl.super__Vector_impl_data._M_start; node_00 != pTVar4;
        node_00 = node_00 + 1) {
      printTOCNode(this,pHVar5,node_00,false);
    }
  }
  return;
}

Assistant:

void printTOCNode (choc::html::HTMLElement& parent, const SourceCodeModel::TableOfContentsNode& node, bool isRoot)
    {
        auto p = &parent;

        if (! isRoot)
        {
            auto& li = parent.addChild ("li");

            if (auto m = node.module)
                li.setClass ("toc_item").addLink ("#" + m->UID).addContent (node.name);
            else if (auto f = node.file)
                li.setClass ("toc_module").addLink ("#" + f->UID).addContent (node.name);
            else
                li.setClass ("toc_item").addContent (node.name);

            p = &li;
        }

        if (! node.children.empty())
        {
            auto& ul = p->addChild ("ul").setClass ("toc_item");

            for (auto& n : node.children)
                printTOCNode (ul, n, false);
        }
    }